

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtScaledBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
cbtScaledTriangleCallback::processTriangle
          (cbtScaledTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtVector3 *v2;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar8;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar7 = in_ZMM0._8_56_;
  v2 = &this->m_localScaling;
  cVar8 = ::operator*(triangle,v2);
  auVar4._0_8_ = cVar8.m_floats._0_8_;
  auVar4._8_56_ = auVar7;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar8.m_floats._8_8_;
  local_68 = vmovlhps_avx(auVar4._0_16_,auVar1);
  auVar7 = ZEXT856(local_68._8_8_);
  cVar8 = ::operator*(triangle + 1,v2);
  auVar5._0_8_ = cVar8.m_floats._0_8_;
  auVar5._8_56_ = auVar7;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = cVar8.m_floats._8_8_;
  local_58 = vmovlhps_avx(auVar5._0_16_,auVar2);
  auVar7 = ZEXT856(local_58._8_8_);
  cVar8 = ::operator*(triangle + 2,v2);
  auVar6._0_8_ = cVar8.m_floats._0_8_;
  auVar6._8_56_ = auVar7;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = cVar8.m_floats._8_8_;
  local_48 = vmovlhps_avx(auVar6._0_16_,auVar3);
  (*this->m_originalCallback->_vptr_cbtTriangleCallback[2])
            (this->m_originalCallback,local_68,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		cbtVector3 newTriangle[3];
		newTriangle[0] = triangle[0] * m_localScaling;
		newTriangle[1] = triangle[1] * m_localScaling;
		newTriangle[2] = triangle[2] * m_localScaling;
		m_originalCallback->processTriangle(&newTriangle[0], partId, triangleIndex);
	}